

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O0

string * QPDF::compute_data_key
                   (string *__return_storage_ptr__,string *encryption_key,int objid,int generation,
                   bool use_aes,int encryption_V,int encryption_R)

{
  ulong uVar1;
  size_t len;
  unsigned_long *puVar2;
  undefined4 in_register_0000000c;
  uchar *puVar3;
  allocator *md;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t n;
  size_t n_00;
  char *pcVar4;
  allocator local_9d;
  int local_9c;
  size_t local_98;
  unsigned_long local_90;
  uchar local_88 [8];
  Digest digest;
  undefined1 local_70 [8];
  MD5 md5;
  string local_48 [8];
  string result;
  int encryption_V_local;
  bool use_aes_local;
  int generation_local;
  int objid_local;
  string *encryption_key_local;
  
  puVar3 = (uchar *)CONCAT44(in_register_0000000c,generation);
  result.field_2._8_4_ = encryption_V;
  result.field_2._M_local_buf[0xf] = use_aes;
  std::__cxx11::string::string(local_48,(string *)encryption_key);
  if ((int)result.field_2._8_4_ < 5) {
    std::__cxx11::string::append((ulong)local_48,'\x01');
    std::__cxx11::string::append((ulong)local_48,'\x01');
    std::__cxx11::string::append((ulong)local_48,'\x01');
    std::__cxx11::string::append((ulong)local_48,'\x01');
    pcVar4 = (char *)0x1;
    std::__cxx11::string::append((ulong)local_48,'\x01');
    n = extraout_RDX;
    if ((result.field_2._M_local_buf[0xf] & 1U) != 0) {
      pcVar4 = "sAlT";
      std::__cxx11::string::operator+=(local_48,"sAlT");
      n = extraout_RDX_00;
    }
    MD5::MD5((MD5 *)local_70,(uchar *)pcVar4,n,puVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    len = std::__cxx11::string::length();
    MD5::encodeDataIncrementally((MD5 *)local_70,pcVar4,len);
    MD5::digest((MD5 *)local_70,local_88);
    puVar3 = local_88;
    local_90 = std::__cxx11::string::length();
    local_9c = 0x10;
    local_98 = toS<int>(&local_9c);
    puVar2 = std::min<unsigned_long>(&local_90,&local_98);
    uVar1 = *puVar2;
    md = &local_9d;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)puVar3,uVar1,md);
    std::allocator<char>::~allocator((allocator<char> *)&local_9d);
    MD5::~MD5((MD5 *)local_70,puVar3,n_00,(uchar *)md);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,local_48);
  }
  std::__cxx11::string::~string(local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDF::compute_data_key(
    std::string const& encryption_key,
    int objid,
    int generation,
    bool use_aes,
    int encryption_V,
    int encryption_R)
{
    // Algorithm 3.1 from the PDF 1.7 Reference Manual

    std::string result = encryption_key;

    if (encryption_V >= 5) {
        // Algorithm 3.1a (PDF 1.7 extension level 3): just use encryption key straight.
        return result;
    }

    // Append low three bytes of object ID and low two bytes of generation
    result.append(1, static_cast<char>(objid & 0xff));
    result.append(1, static_cast<char>((objid >> 8) & 0xff));
    result.append(1, static_cast<char>((objid >> 16) & 0xff));
    result.append(1, static_cast<char>(generation & 0xff));
    result.append(1, static_cast<char>((generation >> 8) & 0xff));
    if (use_aes) {
        result += "sAlT";
    }

    MD5 md5;
    md5.encodeDataIncrementally(result.c_str(), result.length());
    MD5::Digest digest;
    md5.digest(digest);
    return {reinterpret_cast<char*>(digest), std::min(result.length(), toS(16))};
}